

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O2

PyObject * libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)

{
  xmlNodeSetPtr pxVar1;
  xmlNodePtr pxVar2;
  undefined8 uVar3;
  _xmlNode **pp_Var4;
  PyObject *pPVar5;
  long lVar6;
  PyObject *pPVar7;
  long lVar8;
  bool bVar9;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    pPVar7 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  else {
    switch(obj->type) {
    case XPATH_NODESET:
      if ((obj->nodesetval == (xmlNodeSetPtr)0x0) || (obj->nodesetval->nodeNr == 0)) {
        pPVar7 = (PyObject *)PyList_New(0);
      }
      else {
        pPVar7 = (PyObject *)PyList_New();
        for (lVar8 = 0; lVar8 < obj->nodesetval->nodeNr; lVar8 = lVar8 + 1) {
          pxVar2 = obj->nodesetval->nodeTab[lVar8];
          if (pxVar2->type == XML_NAMESPACE_DECL) {
            uVar3 = PyCapsule_New(pxVar2,"xmlNsPtr",libxml_xmlXPathDestructNsNode);
            PyList_SetItem(pPVar7,lVar8,uVar3);
            obj->nodesetval->nodeTab[lVar8] = (xmlNodePtr)0x0;
          }
          else {
            pPVar5 = libxml_xmlNodePtrWrap(pxVar2);
            PyList_SetItem(pPVar7,lVar8,pPVar5);
          }
        }
      }
      break;
    case XPATH_BOOLEAN:
      pPVar7 = (PyObject *)PyLong_FromLong((long)obj->boolval);
      break;
    case XPATH_NUMBER:
      pPVar7 = (PyObject *)PyFloat_FromDouble(obj->floatval);
      break;
    case XPATH_STRING:
      pPVar7 = (PyObject *)PyUnicode_FromString(obj->stringval);
      break;
    default:
      pPVar7 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      break;
    case XPATH_XSLT_TREE:
      pxVar1 = obj->nodesetval;
      if (((pxVar1 != (xmlNodeSetPtr)0x0) && (pxVar1->nodeNr != 0)) &&
         (pxVar1->nodeTab != (xmlNodePtr *)0x0)) {
        lVar8 = 0;
        for (pp_Var4 = &(*pxVar1->nodeTab)->children; *pp_Var4 != (_xmlNode *)0x0;
            pp_Var4 = &(*pp_Var4)->next) {
          lVar8 = lVar8 + 1;
        }
        pPVar7 = (PyObject *)PyList_New(lVar8);
        pp_Var4 = &(*obj->nodesetval->nodeTab)->children;
        lVar6 = 0;
        while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
          pxVar2 = *pp_Var4;
          pPVar5 = libxml_xmlNodePtrWrap(pxVar2);
          PyList_SetItem(pPVar7,lVar6,pPVar5);
          pp_Var4 = &pxVar2->next;
          lVar6 = lVar6 + 1;
        }
        return pPVar7;
      }
      pPVar7 = (PyObject *)PyList_New(0);
      return pPVar7;
    }
    xmlXPathFreeObject(obj);
  }
  return pPVar7;
}

Assistant:

PyObject *
libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)
{
    PyObject *ret;

    if (obj == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    switch (obj->type) {
        case XPATH_XSLT_TREE: {
            if ((obj->nodesetval == NULL) ||
		(obj->nodesetval->nodeNr == 0) ||
		(obj->nodesetval->nodeTab == NULL)) {
                ret = PyList_New(0);
	    } else {
		int i, len = 0;
		xmlNodePtr node;

		node = obj->nodesetval->nodeTab[0]->children;
		while (node != NULL) {
		    len++;
		    node = node->next;
		}
		ret = PyList_New(len);
		node = obj->nodesetval->nodeTab[0]->children;
		for (i = 0;i < len;i++) {
                    PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    node = node->next;
		}
	    }
	    /*
	     * Return now, do not free the object passed down
	     */
	    return (ret);
	}
        case XPATH_NODESET:
            if ((obj->nodesetval == NULL)
                || (obj->nodesetval->nodeNr == 0)) {
                ret = PyList_New(0);
	    } else {
                int i;
                xmlNodePtr node;

                ret = PyList_New(obj->nodesetval->nodeNr);
                for (i = 0; i < obj->nodesetval->nodeNr; i++) {
                    node = obj->nodesetval->nodeTab[i];
                    if (node->type == XML_NAMESPACE_DECL) {
		        PyObject *ns = PyCapsule_New((void *) node,
                                     (char *) "xmlNsPtr",
				     libxml_xmlXPathDestructNsNode);
			PyList_SetItem(ret, i, ns);
			/* make sure the xmlNsPtr is not destroyed now */
			obj->nodesetval->nodeTab[i] = NULL;
		    } else {
			PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    }
                }
            }
            break;
        case XPATH_BOOLEAN:
            ret = PY_IMPORT_INT((long) obj->boolval);
            break;
        case XPATH_NUMBER:
            ret = PyFloat_FromDouble(obj->floatval);
            break;
        case XPATH_STRING:
	    ret = PY_IMPORT_STRING((char *) obj->stringval);
            break;
        default:
            Py_INCREF(Py_None);
            ret = Py_None;
    }
    xmlXPathFreeObject(obj);
    return (ret);
}